

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall libserver::server::_handle_ping_req(server *this)

{
  ostream *poVar1;
  ptime pVar2;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Received ping from ");
  poVar1 = std::operator<<(poVar1,(string *)&this->client_name);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Last ping: ");
  boost::posix_time::to_simple_string_type<char>
            (&local_58,
             (ptime)(this->_ping).
                    super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                    .time_.time_count_.value_);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_58);
  if (this->_map_change == true) {
    _handle_list_request(this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"pok",&local_59);
    std::operator+(&local_58,&local_38,"\n");
    _write_to_socket(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pVar2 = boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
  (this->_ping).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type)
       pVar2.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  this->_map_change = false;
  return;
}

Assistant:

void libserver::server::_handle_ping_req()
{
    // Respond to ping request
    std::cout<<"Received ping from "<<client_name<<std::endl;
    std::cout<<"Last ping: "<<boost::posix_time::to_simple_string(_ping)<<std::endl;
    if(_map_change)
    {
        _handle_list_request();
    }
    else
    {
        _write_to_socket(_PING_RESPONSE_+"\n");
    }
    _ping = boost::posix_time::microsec_clock::local_time();
    _map_change = false;
}